

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if2.c
# Opt level: O3

int script_status(int pi,uint script_id,uint32_t *param)

{
  int __state;
  int sent;
  uint32_t p [11];
  int local_58;
  undefined8 local_54;
  undefined8 uStack_4c;
  undefined8 local_44;
  undefined8 uStack_3c;
  undefined8 local_34;
  
  sent = pigpio_command(pi,0x2d,script_id,0,0);
  if (0 < sent) {
    recvMax(pi,&local_58,0x2c,sent);
    sent = local_58;
    if (param != (uint32_t *)0x0) {
      *(undefined8 *)(param + 8) = local_34;
      *(undefined8 *)(param + 4) = local_44;
      *(undefined8 *)(param + 6) = uStack_3c;
      *(undefined8 *)param = local_54;
      *(undefined8 *)(param + 2) = uStack_4c;
    }
  }
  __state = gCancelState[pi];
  pthread_mutex_unlock((pthread_mutex_t *)(gCmdMutex + pi));
  pthread_setcancelstate(__state,(int *)0x0);
  return sent;
}

Assistant:

int script_status(int pi, unsigned script_id, uint32_t *param)
{
   int status;
   uint32_t p[PI_MAX_SCRIPT_PARAMS+1]; /* space for script status */

   status = pigpio_command(pi, PI_CMD_PROCP, script_id, 0, 0);

   if (status > 0)
   {
      recvMax(pi, p, sizeof(p), status);
      status = p[0];
      if (param) memcpy(param, p+1, sizeof(p)-4);
   }

   _pmu(pi);

   return status;
}